

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void free_rule(Rule *r)

{
  uint local_14;
  uint i;
  Rule *r_local;
  
  free(r->end);
  if ((r->final_code).code != (char *)0x0) {
    free((r->final_code).code);
  }
  if ((r->speculative_code).code != (char *)0x0) {
    free((r->speculative_code).code);
  }
  if (((r->elems).v != (Elem **)0x0) && ((r->elems).v != (r->elems).e)) {
    free((r->elems).v);
  }
  (r->elems).n = 0;
  (r->elems).v = (Elem **)0x0;
  for (local_14 = 0; local_14 < (r->pass_code).n; local_14 = local_14 + 1) {
    free((r->pass_code).v[local_14]->code);
    free((r->pass_code).v[local_14]);
  }
  if (((r->pass_code).v != (Code **)0x0) && ((r->pass_code).v != (r->pass_code).e)) {
    free((r->pass_code).v);
  }
  (r->pass_code).n = 0;
  (r->pass_code).v = (Code **)0x0;
  free(r);
  return;
}

Assistant:

static void free_rule(Rule *r) {
  uint i;
  FREE(r->end);
  if (r->final_code.code) FREE(r->final_code.code);
  if (r->speculative_code.code) FREE(r->speculative_code.code);
  vec_free(&r->elems);
  for (i = 0; i < r->pass_code.n; i++) {
    FREE(r->pass_code.v[i]->code);
    FREE(r->pass_code.v[i]);
  }
  vec_free(&r->pass_code);
  FREE(r);
}